

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O0

const_ret_type __thiscall
dlib::
op_add_scalar<dlib::matrix_op<dlib::op_sumc<dlib::matrix_op<dlib::op_squared<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>_>
::apply(op_add_scalar<dlib::matrix_op<dlib::op_sumc<dlib::matrix_op<dlib::op_squared<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>_>
        *this,long r,long c)

{
  matrix_op<dlib::op_sumc<dlib::matrix_op<dlib::op_squared<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>
  *in_RDI;
  const_ret_type cVar1;
  long in_stack_ffffffffffffffd8;
  
  cVar1 = matrix_op<dlib::op_sumc<dlib::matrix_op<dlib::op_squared<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>
          ::operator()(in_RDI,in_stack_ffffffffffffffd8,0x27fc5f);
  return cVar1 + *(float *)&in_RDI[1].op.m;
}

Assistant:

const_ret_type apply (long r, long c) const
        { 
            return this->m(r,c) + s;
        }